

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool __thiscall
tinyusdz::Prim::replace_child(Prim *this,string *child_prim_name,Prim *rhs,string *err)

{
  Prim *pPVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  string *psVar7;
  reference this_00;
  Value *pVVar8;
  Path *pPVar9;
  allocator local_341;
  string local_340;
  Path local_320;
  allocator local_249;
  string local_248;
  string local_228;
  allocator local_201;
  string local_200;
  Path local_1e0;
  allocator local_109;
  string local_108;
  string local_e8;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  local_c8;
  anon_class_32_1_a5ed6701_for__M_pred local_c0;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  local_a0;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  local_98;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  local_90;
  __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
  result;
  ulong local_80;
  size_t i;
  string local_70 [32];
  string local_50;
  string *local_30;
  string *err_local;
  Prim *rhs_local;
  string *child_prim_name_local;
  Prim *this_local;
  
  local_30 = err;
  err_local = (string *)rhs;
  rhs_local = (Prim *)child_prim_name;
  child_prim_name_local = (string *)this;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) && (local_30 != (string *)0x0)) {
    std::__cxx11::string::operator+=((string *)local_30,"child_prim_name is empty.\n");
  }
  bVar2 = ValidatePrimElementName((string *)rhs_local);
  if ((!bVar2) && (local_30 != (string *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,"`{}` is not a valid Prim name.\n",(allocator *)((long)&i + 7));
    fmt::format<std::__cxx11::string>(&local_50,(fmt *)local_70,(string *)rhs_local,err);
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  }
  sVar4 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(&this->_children);
  sVar5 = std::
          multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->_childrenNameSet);
  if (sVar4 != sVar5) {
    std::
    multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->_childrenNameSet);
    for (local_80 = 0;
        sVar4 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(&this->_children)
        , local_80 < sVar4; local_80 = local_80 + 1) {
      pvVar6 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         (&this->_children,local_80);
      element_name_abi_cxx11_(pvVar6);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        if (local_30 != (string *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)local_30,
                     "Internal error: Existing child Prim\'s elementName is empty.\n");
        }
        return false;
      }
      pvVar6 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         (&this->_children,local_80);
      psVar7 = element_name_abi_cxx11_(pvVar6);
      sVar5 = std::
              multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->_childrenNameSet,psVar7);
      if (sVar5 != 0) {
        if (local_30 != (string *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)local_30,
                     "Internal error: _children contains Prim with same elementName.\n");
        }
        return false;
      }
      pvVar6 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         (&this->_children,local_80);
      psVar7 = element_name_abi_cxx11_(pvVar6);
      result._M_current =
           (Prim *)std::
                   multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(&this->_childrenNameSet,psVar7);
    }
  }
  local_98._M_current =
       (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(&this->_children)
  ;
  local_a0._M_current =
       (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(&this->_children);
  std::__cxx11::string::string((string *)&local_c0,(string *)rhs_local);
  local_90 = std::
             find_if<__gnu_cxx::__normal_iterator<tinyusdz::Prim*,std::vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>>>,tinyusdz::Prim::replace_child(std::__cxx11::string_const&,tinyusdz::Prim&&,std::__cxx11::string*)::__0>
                       (local_98,local_a0,&local_c0);
  replace_child(std::__cxx11::string_const&,tinyusdz::Prim&&,std::__cxx11::string*)::$_0::~__0
            ((__0 *)&local_c0);
  local_c8._M_current =
       (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(&this->_children);
  bVar2 = __gnu_cxx::operator!=(&local_90,&local_c8);
  if (bVar2) {
    pVVar8 = get_data((Prim *)err_local);
    bVar2 = SetPrimElementName(pVVar8,(string *)rhs_local);
    pPVar1 = rhs_local;
    if (!bVar2) {
      if (local_30 != (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_108,"Internal error. cannot modify Prim\'s elementName.\n",
                   &local_109);
        fmt::format(&local_e8,&local_108);
        std::__cxx11::string::operator=((string *)local_30,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
      }
      return false;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"",&local_201);
    Path::Path(&local_1e0,(string *)pPVar1,&local_200);
    pPVar9 = element_path((Prim *)err_local);
    Path::operator=(pPVar9,&local_1e0);
    Path::~Path(&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    psVar7 = err_local;
    this_00 = __gnu_cxx::
              __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
              ::operator*(&local_90);
    operator=(this_00,(Prim *)psVar7);
  }
  else {
    pVVar8 = get_data((Prim *)err_local);
    bVar2 = SetPrimElementName(pVVar8,(string *)rhs_local);
    pPVar1 = rhs_local;
    if (!bVar2) {
      if (local_30 != (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_248,"Internal error. cannot modify Prim\'s elementName.\n",
                   &local_249);
        fmt::format(&local_228,&local_248);
        std::__cxx11::string::operator=((string *)local_30,(string *)&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
      }
      return false;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_340,"",&local_341);
    Path::Path(&local_320,(string *)pPVar1,&local_340);
    pPVar9 = element_path((Prim *)err_local);
    Path::operator=(pPVar9,&local_320);
    Path::~Path(&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::
    multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->_childrenNameSet,(value_type *)rhs_local);
    std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
              (&this->_children,(Prim *)err_local);
  }
  this->_child_dirty = true;
  return true;
}

Assistant:

bool Prim::replace_child(const std::string &child_prim_name, Prim &&rhs,
                         std::string *err) {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (child_prim_name.empty()) {
    if (err) {
      (*err) += "child_prim_name is empty.\n";
    }
  }

  if (!ValidatePrimElementName(child_prim_name)) {
    if (err) {
      (*err) +=
          fmt::format("`{}` is not a valid Prim name.\n", child_prim_name);
    }
  }

  if (_children.size() != _childrenNameSet.size()) {
    // Rebuild _childrenNames
    _childrenNameSet.clear();
    for (size_t i = 0; i < _children.size(); i++) {
      if (_children[i].element_name().empty()) {
        if (err) {
          (*err) =
              "Internal error: Existing child Prim's elementName is empty.\n";
        }
        return false;
      }

      if (_childrenNameSet.count(_children[i].element_name())) {
        if (err) {
          (*err) =
              "Internal error: _children contains Prim with same "
              "elementName.\n";
        }
        return false;
      }

      _childrenNameSet.insert(_children[i].element_name());
    }
  }

  // Simple linear scan
  auto result = std::find_if(_children.begin(), _children.end(),
                             [child_prim_name](const Prim &p) {
                               return (p.element_name() == child_prim_name);
                             });

  if (result != _children.end()) {
    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(rhs.get_data(), child_prim_name)) {
      if (err) {
        (*err) =
            fmt::format("Internal error. cannot modify Prim's elementName.\n");
      }
      return false;
    }
    rhs.element_path() = Path(child_prim_name, /* prop_part */ "");

    (*result) = std::move(rhs);  // replace

  } else {
    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(rhs.get_data(), child_prim_name)) {
      if (err) {
        (*err) =
            fmt::format("Internal error. cannot modify Prim's elementName.\n");
      }
      return false;
    }
    rhs.element_path() = Path(child_prim_name, /* prop_part */ "");

    _childrenNameSet.insert(child_prim_name);
    _children.emplace_back(std::move(rhs));  // add
  }

  _child_dirty = true;

  return true;
}